

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O2

bool adios2::utils::introspectAsBPFile(ifstream *f,string *name)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  char *pcVar6;
  bool bVar7;
  char *pcVar8;
  allocator_type local_59;
  vector<char,_std::allocator<char>_> buffer;
  string VersionTag;
  
  VersionTag._M_dataplus._M_p = VersionTag._M_dataplus._M_p & 0xffffffffffffff00;
  std::vector<char,_std::allocator<char>_>::vector(&buffer,0x38,(value_type *)&VersionTag,&local_59)
  ;
  std::istream::seekg((long)f,_S_beg);
  uVar5 = std::istream::tellg();
  if (0x37 < (long)uVar5) {
    std::istream::seekg((long)f,0xffffffc8);
    std::istream::read((char *)f,
                       (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start);
    bVar7 = true;
    if (((byte)f[*(long *)(*(long *)f + -0x18) + 0x20] & 5) != 0) goto LAB_0011843f;
    bVar1 = buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_start[0x34];
    if (bVar1 < 2) {
      bVar7 = false;
      if ((3 < (byte)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start[0x36]) ||
         (buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[0x36] == 1)) goto LAB_0011843f;
      bVar2 = buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
              ._M_start[0x37];
      if (0xfc < (byte)(bVar2 - 4)) {
        VersionTag._M_dataplus._M_p = (pointer)&VersionTag.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&VersionTag,
                   buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + 0x1c);
        if ((bVar1 == 1) ||
           (((*(ulong *)(buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start + 0x2c) < uVar5 &&
             (*(ulong *)(buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start + 0x1c) <
              *(ulong *)(buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start + 0x24))) &&
            (*(ulong *)(buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start + 0x24) <
             *(ulong *)(buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start + 0x2c))))) {
          if (bVar2 < 3) {
            printf("ADIOS-BP Version %d\n",(ulong)(uint)(int)(char)bVar2);
          }
          else {
            bVar2 = buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start[0x18];
            bVar3 = buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start[0x1a];
            bVar4 = buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start[0x19] - 0x30;
            if (bVar2 < 0x31) {
              bVar4 = buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start[0x19];
            }
            pcVar6 = VersionTag._M_dataplus._M_p + 10;
            do {
              pcVar8 = pcVar6;
              pcVar6 = pcVar8 + 1;
            } while ((byte)(*pcVar8 - 0x30U) < 10 || *pcVar8 == '.');
            if (0x30 < bVar2) {
              bVar3 = bVar3 - 0x30;
              bVar2 = bVar2 - 0x30;
            }
            *pcVar8 = '\0';
            pcVar6 = "Little Endian";
            if (bVar1 == 1) {
              pcVar6 = "Big Endian";
            }
            printf("ADIOS-BP Version %d %s - ADIOS v%d.%d.%d\n",3,pcVar6,(ulong)bVar2,(ulong)bVar4,
                   (ulong)bVar3);
          }
          std::__cxx11::string::~string((string *)&VersionTag);
          bVar7 = true;
          goto LAB_0011843f;
        }
        std::__cxx11::string::~string((string *)&VersionTag);
      }
    }
  }
  bVar7 = false;
LAB_0011843f:
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&buffer.super__Vector_base<char,_std::allocator<char>_>);
  return bVar7;
}

Assistant:

bool introspectAsBPFile(std::ifstream &f, const std::string &name) noexcept
{
    const int MFOOTERSIZE = 56;
    std::vector<char> buffer(MFOOTERSIZE, 0);
    f.seekg(0, f.end);
    auto flength = f.tellg();
    if (flength < MFOOTERSIZE)
    {
        return false;
    }
    f.seekg(-MFOOTERSIZE, f.end);
    f.read(buffer.data(), MFOOTERSIZE);
    if (f)
    {
        const uint8_t endianness = static_cast<uint8_t>(buffer[52]);
        if (endianness > 1)
        {
            return false;
        }
        bool IsBigEndian = (endianness == 1) ? true : false;

        const int8_t fileType = static_cast<int8_t>(buffer[54]);
        if (fileType != 0 && fileType != 2 && fileType != 3)
        {
            return false;
        }
        const int8_t BPVersion = static_cast<uint8_t>(buffer[55]);
        if (BPVersion < 1 || BPVersion > 3)
        {
            return false;
        }

        size_t position = 0;
        std::string VersionTag(buffer.data(), 28);
        position = 28;

        if (!IsBigEndian)
        {
            uint64_t PGIndexStart = helper::ReadValue<uint64_t>(buffer, position, !IsBigEndian);
            uint64_t VarsIndexStart = helper::ReadValue<uint64_t>(buffer, position, !IsBigEndian);
            uint64_t AttributesIndexStart =
                helper::ReadValue<uint64_t>(buffer, position, !IsBigEndian);
            if (PGIndexStart >= VarsIndexStart || VarsIndexStart >= AttributesIndexStart ||
                AttributesIndexStart >= static_cast<uint64_t>(flength))
            {
                return false;
            }
        }

        if (BPVersion < 3)
        {
            printf("ADIOS-BP Version %d\n", BPVersion);
        }
        else
        {
            uint8_t major = static_cast<uint8_t>(buffer[24]);
            uint8_t minor = static_cast<uint8_t>(buffer[25]);
            uint8_t patch = static_cast<uint8_t>(buffer[26]);
            if (major > '0')
            {
                // ADIOS2 writes these as ASCII characters
                major -= '0';
                minor -= '0';
                patch -= '0';
            }

            /* Cleanup ADIOS2 bug here: VersionTag is not filled with 0s */
            int pos = 10;
            while (VersionTag[pos] == '.' || (VersionTag[pos] >= '0' && VersionTag[pos] <= '9'))
            {
                ++pos;
            }
            VersionTag[pos] = '\0';
            printf("ADIOS-BP Version %d %s - ADIOS v%d.%d.%d\n", BPVersion,
                   (IsBigEndian ? "Big Endian" : "Little Endian"), major, minor, patch);
        }
    }
    return true;
}